

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(uint lhs,SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  uint ret;
  uchar local_1a;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_19;
  uint local_18;
  uint local_14;
  
  local_18 = 0;
  local_1a = rhs.m_int;
  local_14 = lhs;
  DivisionHelper<unsigned_int,_unsigned_char,_0>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_14,&local_1a,&local_18);
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<unsigned_int>(&local_19,&local_18);
  return (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         local_19.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}